

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O3

optional<wasm::Name> * __thiscall
wasm::WATParser::anon_unknown_11::ParseInput::takeID
          (optional<wasm::Name> *__return_storage_ptr__,ParseInput *this)

{
  long lVar1;
  long lVar2;
  optional<wasm::Name> *in_RAX;
  optional<wasm::Name> *poVar3;
  optional<wasm::Name> *extraout_RAX;
  optional<wasm::Name> *extraout_RAX_00;
  optional<wasm::Name> *extraout_RAX_01;
  undefined1 in_CL;
  string_view sVar4;
  _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
  local_88;
  byte local_58;
  long *local_50;
  IString *local_48;
  long local_40 [2];
  
  if (((this->lexer).curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
       super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
       super__Optional_payload_base<wasm::WATParser::Token>._M_engaged == true) &&
     ((this->lexer).index != 0)) {
    lVar1 = (this->lexer).curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload
            .super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
            super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.span._M_len;
    lVar2 = *(long *)((long)&(this->lexer).curr.
                             super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
                             super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                             super__Optional_payload_base<wasm::WATParser::Token>._M_payload + 8);
    std::__detail::__variant::
    _Copy_ctor_base<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                       *)&local_88,
                      (_Copy_ctor_base<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                       *)((long)&(this->lexer).curr.
                                 super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                 _M_payload.
                                 super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                 .super__Optional_payload_base<wasm::WATParser::Token>._M_payload +
                         0x10));
    local_58 = 1;
    if (local_88._M_index == '\x02') {
      if (lVar1 == 0) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",1,
                   0);
      }
      Lexer::skipSpace(&this->lexer);
      Lexer::lexToken(&this->lexer);
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,lVar2 + 1,lVar1 + lVar2);
      sVar4._M_str = (char *)0x0;
      sVar4._M_len = (size_t)local_50;
      sVar4 = IString::interned(local_48,sVar4,(bool)in_CL);
      poVar3 = (optional<wasm::Name> *)sVar4._M_len;
      (__return_storage_ptr__->super__Optional_base<wasm::Name,_true,_true>)._M_payload.
      super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str = sVar4;
      (__return_storage_ptr__->super__Optional_base<wasm::Name,_true,_true>)._M_payload.
      super__Optional_payload_base<wasm::Name>._M_engaged = true;
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
        poVar3 = extraout_RAX;
      }
      if ((local_58 & 1) == 0) {
        return poVar3;
      }
      local_58 = 0;
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
      ::~_Variant_storage(&local_88);
      return extraout_RAX_00;
    }
    local_58 = 0;
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    ::~_Variant_storage(&local_88);
    in_RAX = extraout_RAX_01;
  }
  (__return_storage_ptr__->super__Optional_base<wasm::Name,_true,_true>)._M_payload.
  super__Optional_payload_base<wasm::Name>._M_engaged = false;
  return in_RAX;
}

Assistant:

std::optional<Name> takeID() {
    if (auto t = peek()) {
      if (auto id = t->getID()) {
        ++lexer;
        // See comment on takeName.
        return Name(std::string(*id));
      }
    }
    return {};
  }